

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

void __thiscall LexicalAnalyzer::RemoveComment(LexicalAnalyzer *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar1;
  ulong uVar2;
  pointer pbVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  iterator iter;
  char *pcVar8;
  iterator __position;
  undefined8 uStack_70;
  LexicalAnalyzer *pLStack_68;
  ulong uStack_60;
  long lStack_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_50;
  char *pcStack_48;
  undefined8 uStack_40;
  
  this_00 = &this->lines;
  __position._M_current =
       (this->lines).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != __position._M_current) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pcVar8 = (char *)((long)&((__position._M_current)->_M_dataplus)._M_p + lVar7);
      uStack_40 = 0x105ba6;
      lVar1 = std::__cxx11::string::find(pcVar8,0x124150,0);
      if (lVar1 << 0x20 != -0x100000000) {
        uVar2 = (lVar1 << 0x20) >> 0x20;
        pbVar3 = (this_00->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(ulong *)((long)&pbVar3->_M_string_length + lVar7) < uVar2) {
          pcVar5 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
          uStack_40 = 0x105c35;
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar2);
          uStack_70 = *(long *)(pcVar5 + 0x28);
          if (uStack_70 != *(long *)(pcVar5 + 0x20)) {
            uStack_40 = 0xffffffff00000000;
            lVar1 = 8;
            uVar2 = 0;
            pLStack_68 = this;
            uStack_60 = uVar6;
            lStack_58 = lVar7;
            pvStack_50 = this_00;
            pcStack_48 = pcVar8;
            do {
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar2);
              uStack_70 = CONCAT17(9,(undefined7)uStack_70);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,(char *)((long)&uStack_70 + 7),1);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,*(char **)(*(long *)(pcVar5 + 0x20) + -8 + lVar1),
                                  *(long *)(*(long *)(pcVar5 + 0x20) + lVar1));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              uVar2 = uVar2 + 1;
              lVar1 = lVar1 + 0x20;
            } while (uVar2 < (ulong)(*(long *)(pcVar5 + 0x28) - *(long *)(pcVar5 + 0x20) >> 5));
          }
          return;
        }
        *(ulong *)((long)&pbVar3->_M_string_length + lVar7) = uVar2;
        *(undefined1 *)(*(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar7) + uVar2) = 0;
      }
      uVar6 = uVar6 + 1;
      __position._M_current =
           (this->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x20;
    } while (uVar6 < (ulong)((long)pbVar3 - (long)__position._M_current >> 5));
  }
  while (__position._M_current != pbVar3) {
    if ((__position._M_current)->_M_string_length == 0) {
      uStack_40 = 0x105c05;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(this_00,__position);
      pbVar3 = (this->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void LexicalAnalyzer::RemoveComment() {
    for (int i = 0; i < lines.size(); i++) {
        //std::cout<<lines[i]<<std::endl;
        int pos = lines[i].find("//");//double //
        if (pos != std::string::npos) {//Find double //
            lines[i].erase(pos);//Erase [pos,]
        }
    }
    // erase empty string in lines
    for (std::vector<std::string>::iterator iter = lines.begin(); iter != lines.end();) {
        if (iter->empty()) {
            lines.erase(iter);
        } else
            iter++;
    }
}